

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

void __thiscall Fl_Tree::resize(Fl_Tree *this,int X,int Y,int W,int H)

{
  fix_scrollbar_order(this);
  Fl_Group::resize(&this->super_Fl_Group,X,Y,W,H);
  Fl_Group::init_sizes(&this->super_Fl_Group);
  return;
}

Assistant:

void Fl_Tree::resize(int X,int Y,int W, int H) {
  fix_scrollbar_order();
  Fl_Group::resize(X,Y,W,H);
#if FLTK_ABI_VERSION >= 10303
  calc_dimensions();
#endif
  init_sizes();
}